

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  code *pcVar5;
  undefined4 *puVar6;
  long lVar7;
  ulong uVar8;
  ostringstream *poVar9;
  long lVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  long lVar13;
  undefined4 *puVar14;
  bool bVar15;
  Array<float,_9> a;
  long *local_220;
  long local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  int local_1fc;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ShaderMatrixCase *local_1b8;
  code *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar3;
  
  local_1fc = programID;
  local_1b8 = this;
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  puVar6 = &s_constInMat4;
  puVar14 = &s_constInMat3;
  puVar12 = &s_constInMat2;
  lVar7 = 0;
  do {
    lVar13 = 0x128;
    if (lVar7 == 1) {
      lVar13 = 0x134;
    }
    if (*(int *)((long)&(local_1b8->super_ShaderRenderCase).super_TestCase.super_TestNode.
                        _vptr_TestNode + lVar13) != 1) goto switchD_002f72cf_caseD_6;
    local_1b0 = *(code **)(lVar3 + 0xb48);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"u_in","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,(int)lVar7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar8 = local_1e8[0];
    }
    if (uVar8 < (ulong)(local_1d0 + local_1f0)) {
      uVar8 = 0xf;
      if (local_1d8 != local_1c8) {
        uVar8 = local_1c8[0];
      }
      if (uVar8 < (ulong)(local_1d0 + local_1f0)) goto LAB_002f71d8;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
    }
    else {
LAB_002f71d8:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
    }
    local_220 = &local_210;
    plVar1 = puVar4 + 2;
    if ((long *)*puVar4 == plVar1) {
      local_210 = *plVar1;
      uStack_208 = *(undefined4 *)(puVar4 + 3);
      uStack_204 = *(undefined4 *)((long)puVar4 + 0x1c);
    }
    else {
      local_210 = *plVar1;
      local_220 = (long *)*puVar4;
    }
    *puVar4 = plVar1;
    puVar4[1] = 0;
    *(undefined1 *)plVar1 = 0;
    iVar2 = (*local_1b0)(local_1fc);
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    if (iVar2 < 0) goto switchD_002f72cf_caseD_6;
    switch(*(undefined4 *)
            ((long)&(local_1b8->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode
            + lVar13 + 4)) {
    case 1:
      (**(code **)(lVar3 + 0x14e0))((&s_constInFloat)[lVar7],iVar2);
      break;
    case 2:
      (**(code **)(lVar3 + 0x1528))(iVar2,1,&s_constInVec2 + lVar7);
      break;
    case 3:
      (**(code **)(lVar3 + 0x1568))(iVar2,1,(long)&s_constInVec3 + lVar7 * 0xc);
      break;
    case 4:
      (**(code **)(lVar3 + 0x15a8))(iVar2,1,s_constInVec4 + lVar7 * 0x10);
      break;
    case 5:
      pcVar5 = *(code **)(lVar3 + 0x15e0);
      poVar9 = local_1a8;
      lVar13 = 0;
      puVar11 = puVar12;
      do {
        lVar10 = 0;
        do {
          *(undefined4 *)(poVar9 + lVar10) = *(undefined4 *)((long)puVar11 + lVar10);
          lVar10 = lVar10 + 4;
        } while (lVar10 == 4);
        puVar11 = puVar11 + 2;
        poVar9 = poVar9 + lVar10;
        bVar15 = lVar13 == 0;
        lVar13 = lVar13 + 1;
      } while (bVar15);
      goto LAB_002f7433;
    case 9:
      pcVar5 = *(code **)(lVar3 + 0x1610);
      lVar13 = 0;
      poVar9 = local_1a8;
      puVar11 = puVar14;
      do {
        lVar10 = 0;
        do {
          *(undefined4 *)(poVar9 + lVar10) = *(undefined4 *)((long)puVar11 + lVar10);
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar13 = lVar13 + 1;
        puVar11 = puVar11 + 3;
        poVar9 = poVar9 + 0xc;
      } while (lVar13 != 3);
      goto LAB_002f7433;
    case 0xd:
      pcVar5 = *(code **)(lVar3 + 0x1640);
      lVar13 = 0;
      poVar9 = local_1a8;
      puVar11 = puVar6;
      do {
        lVar10 = 0;
        do {
          *(undefined4 *)(poVar9 + lVar10) = *(undefined4 *)((long)puVar11 + lVar10);
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0x10);
        lVar13 = lVar13 + 1;
        puVar11 = puVar11 + 4;
        poVar9 = poVar9 + 0x10;
      } while (lVar13 != 4);
LAB_002f7433:
      (*pcVar5)(iVar2,1,0);
    }
switchD_002f72cf_caseD_6:
    lVar7 = lVar7 + 1;
    puVar6 = puVar6 + 0x10;
    puVar14 = puVar14 + 9;
    puVar12 = puVar12 + 4;
    if (lVar7 == 2) {
      return;
    }
  } while( true );
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);													break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());										break;
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv(loc, 1, GL_FALSE, s_constInMat2[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv(loc, 1, GL_FALSE, s_constInMat3[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv(loc, 1, GL_FALSE, s_constInMat4[inNdx].getColumnMajorData().getPtr());	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}